

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void closegoto(LexState *ls,int g,Labeldesc *label,int bup)

{
  FuncState *fs_00;
  Dyndata *pDVar1;
  int iVar2;
  lu_byte lVar3;
  undefined6 uVar4;
  byte bVar5;
  Labellist *pLVar6;
  Labeldesc *pLVar7;
  Labeldesc *pLVar8;
  lu_byte stklevel;
  Labeldesc *gt;
  Labellist *gl;
  FuncState *fs;
  int i;
  int bup_local;
  Labeldesc *label_local;
  int g_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pDVar1 = ls->dyd;
  pLVar6 = &pDVar1->gt;
  pLVar7 = pLVar6->arr + g;
  if (pLVar7->nactvar < label->nactvar) {
    jumpscopeerror(ls,pLVar7);
  }
  if ((pLVar7->close != '\0') || ((label->nactvar < pLVar7->nactvar && (bup != 0)))) {
    bVar5 = reglevel(fs_00,(uint)label->nactvar);
    fs_00->f->code[pLVar7->pc + 1] = fs_00->f->code[pLVar7->pc];
    fs_00->f->code[pLVar7->pc] = (uint)bVar5 << 7 | 0x36;
    pLVar7->pc = pLVar7->pc + 1;
  }
  luaK_patchlist(ls->fs,pLVar7->pc,label->pc);
  for (fs._0_4_ = g; (int)fs < (pDVar1->gt).n + -1; fs._0_4_ = (int)fs + 1) {
    pLVar7 = pLVar6->arr + (int)fs;
    pLVar8 = pLVar6->arr + ((int)fs + 1);
    pLVar7->name = pLVar8->name;
    iVar2 = pLVar8->line;
    pLVar7->pc = pLVar8->pc;
    pLVar7->line = iVar2;
    lVar3 = pLVar8->close;
    uVar4 = *(undefined6 *)&pLVar8->field_0x12;
    pLVar7->nactvar = pLVar8->nactvar;
    pLVar7->close = lVar3;
    *(undefined6 *)&pLVar7->field_0x12 = uVar4;
  }
  (pDVar1->gt).n = (pDVar1->gt).n + -1;
  return;
}

Assistant:

static void closegoto (LexState *ls, int g, Labeldesc *label, int bup) {
  int i;
  FuncState *fs = ls->fs;
  Labellist *gl = &ls->dyd->gt;  /* list of gotos */
  Labeldesc *gt = &gl->arr[g];  /* goto to be resolved */
  lua_assert(eqstr(gt->name, label->name));
  if (l_unlikely(gt->nactvar < label->nactvar))  /* enter some scope? */
    jumpscopeerror(ls, gt);
  if (gt->close ||
      (label->nactvar < gt->nactvar && bup)) {  /* needs close? */
    lu_byte stklevel = reglevel(fs, label->nactvar);
    /* move jump to CLOSE position */
    fs->f->code[gt->pc + 1] = fs->f->code[gt->pc];
    /* put CLOSE instruction at original position */
    fs->f->code[gt->pc] = CREATE_ABCk(OP_CLOSE, stklevel, 0, 0, 0);
    gt->pc++;  /* must point to jump instruction */
  }
  luaK_patchlist(ls->fs, gt->pc, label->pc);  /* goto jumps to label */
  for (i = g; i < gl->n - 1; i++)  /* remove goto from pending list */
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}